

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

bool __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::insert_internal(db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *this,art_key_type k,value_type v)

{
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_00;
  bool bVar1;
  node_type type;
  int iVar2;
  pointer ptr;
  header_type *phVar3;
  reference pvVar4;
  art_key_type k_00;
  art_key_type k_01;
  art_key_type k_02;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  byte local_191;
  basic_node_ptr<unodb::detail::node_header> local_190;
  undefined1 local_188 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node_1;
  undefined1 local_158 [8];
  basic_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>,_header_type,_unodb::db>
  leaf_2;
  uint local_138;
  byte local_131;
  uint shared_prefix_len;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *key_prefix;
  inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode;
  undefined1 local_108 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node;
  undefined1 local_d8 [8];
  basic_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>,_header_type,_unodb::db>
  new_leaf;
  undefined1 auStack_b0 [4];
  int cmp;
  key_view existing_key;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *leaf_1
  ;
  undefined1 auStack_90 [7];
  node_type node_type;
  art_key_type remaining_key;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *pdStack_78;
  tree_depth_type depth;
  node_ptr *node;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_68;
  pointer local_60;
  size_t local_58;
  pointer local_50;
  undefined1 local_48 [8];
  basic_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>,_header_type,_unodb::db>
  leaf;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  value_type v_local;
  art_key_type k_local;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  this_local = (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *)v._M_ptr;
  v_00._M_ptr = k.field_0._8_8_;
  v_local._M_extent._M_extent_value = k.field_0._0_8_;
  leaf._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
  ._M_head_impl =
       (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *
       )this;
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (bVar1) {
    local_58 = v_local._M_extent._M_extent_value;
    local_68 = this_local;
    local_60 = v_local._M_ptr;
    k_00.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)
         (__extent_storage<18446744073709551615UL>)v_local._M_extent._M_extent_value;
    k_00.field_0.key._M_ptr = local_48;
    v_00._M_extent._M_extent_value = (size_t)this_local;
    local_50 = v_00._M_ptr;
    detail::
    basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
    ::make_db_leaf_ptr(k_00,v_00,(db_type *)v_local._M_ptr);
    ptr = std::
          unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::release((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_48);
    detail::basic_node_ptr<unodb::detail::node_header>::basic_node_ptr
              ((basic_node_ptr<unodb::detail::node_header> *)&node,(header_type *)ptr,LEAF);
    (this->root).tagged_ptr = (uintptr_t)node;
    k_local.field_0.key_bytes._M_elems[0xf] = 1;
    std::
    unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_48);
  }
  else {
    pdStack_78 = this;
    detail::
    tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>::
    tree_depth((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),0);
    _auStack_90 = v_local._M_extent._M_extent_value;
    remaining_key.field_0.key._M_ptr = v_00._M_ptr;
    while (type = detail::basic_node_ptr<unodb::detail::node_header>::type(&pdStack_78->root),
          type != LEAF) {
      if (type == LEAF) {
        __assert_fail("node_type != node_type::LEAF",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3bd,
                      "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      key_prefix = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                    *)detail::basic_node_ptr<unodb::detail::node_header>::
                      ptr<unodb::detail::inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                                (&pdStack_78->root);
      _shared_prefix_len =
           detail::
           basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
           ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             *)&key_prefix->f);
      local_131 = detail::
                  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                  ::length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                            *)&_shared_prefix_len->f);
      leaf_2._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
      ._M_head_impl =
           (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
            *)_auStack_90;
      shifted_key.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)remaining_key.field_0.key._M_ptr;
      shifted_key.field_0.key._M_ptr = (pointer)_auStack_90;
      local_138 = detail::
                  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                       *)&_shared_prefix_len->f,shifted_key);
      if (local_138 < local_131) {
        new_node_1._M_t.
        super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
        ._M_head_impl =
             (inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)this_local;
        k_02.field_0.key._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)
             (__extent_storage<18446744073709551615UL>)v_local._M_extent._M_extent_value;
        k_02.field_0.key._M_ptr = (pointer)local_158;
        v_02._M_extent._M_extent_value = (size_t)this_local;
        v_02._M_ptr = v_00._M_ptr;
        detail::
        basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
        ::make_db_leaf_ptr(k_02,v_02,(db_type *)v_local._M_ptr);
        detail::
        basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
        ::
        create<unodb::detail::basic_node_ptr<unodb::detail::node_header>&,unsigned_int_const&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>>
                  ((basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                    *)local_188,this,&pdStack_78->root,&local_138,
                   (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),
                   (unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    *)local_158);
        phVar3 = (header_type *)
                 std::
                 unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ::release((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            *)local_188);
        detail::basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_190,phVar3,I4);
        (pdStack_78->root).tagged_ptr = local_190.tagged_ptr;
        account_growing_inode<(unodb::node_type)1>(this);
        this->key_prefix_splits = this->key_prefix_splits + 1;
        pvVar4 = std::array<unsigned_long,_4UL>::operator[](&this->growing_inode_counts,0);
        if (this->key_prefix_splits < *pvVar4) {
          std::
          unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_188);
          std::
          unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_158);
          return true;
        }
        __assert_fail("growing_inode_counts[internal_as_i<node_type::I4>] > key_prefix_splits",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3d0,
                      "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      if (local_138 != local_131) {
        __assert_fail("shared_prefix_len == key_prefix_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3d6,
                      "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      detail::
      tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
      ::operator+=((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),
                   (uint)local_131);
      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_90,
                 (ulong)local_131);
      this_00 = key_prefix;
      local_191 = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                  operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                             auStack_90,0);
      pdStack_78 = (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    *)detail::
                      basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                      ::
                      add_or_choose_subtree<unodb::detail::basic_node_ptr<unodb::detail::node_header>*,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                                ((basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                                  *)&this_00->f,type,&local_191,
                                 (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                  *)&v_local._M_extent,
                                 (span<const_std::byte,_18446744073709551615UL> *)&this_local,this,
                                 (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                                  *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4)
                                 ,(basic_node_ptr<unodb::detail::node_header> **)
                                  &stack0xffffffffffffff88);
      if (pdStack_78 ==
          (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *)0x0) {
        return true;
      }
      detail::
      tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
      ::operator++((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4));
      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_90,1)
      ;
    }
    existing_key._M_extent._M_extent_value =
         (size_t)detail::basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>*>
                           (&pdStack_78->root);
    _auStack_b0 = detail::
                  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
                  ::get_key_view((basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
                                  *)existing_key._M_extent._M_extent_value);
    new_leaf._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
    ._M_head_impl = _auStack_b0;
    iVar2 = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::cmp
                      ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                       &v_local._M_extent,_auStack_b0,existing_key._M_ptr);
    if (iVar2 == 0) {
      k_local.field_0.key_bytes._M_elems[0xf] = 0;
    }
    else {
      new_node._M_t.
      super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
      ._M_head_impl =
           (inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *)this_local;
      k_01.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)v_local._M_extent._M_extent_value;
      k_01.field_0.key._M_ptr = (pointer)local_d8;
      v_01._M_extent._M_extent_value = (size_t)this_local;
      v_01._M_ptr = v_00._M_ptr;
      detail::
      basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
      ::make_db_leaf_ptr(k_01,v_01,(db_type *)v_local._M_ptr);
      detail::
      basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
      ::
      create<std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>*const&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>>
                ((basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                  *)local_108,this,(span<const_std::byte,_18446744073709551615UL> *)auStack_b0,
                 (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_90,
                 (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),
                 (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
                  **)&existing_key._M_extent,
                 (unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  *)local_d8);
      phVar3 = (header_type *)
               std::
               unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ::release((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          *)local_108);
      detail::basic_node_ptr<unodb::detail::node_header>::basic_node_ptr
                ((basic_node_ptr<unodb::detail::node_header> *)&inode,phVar3,I4);
      (pdStack_78->root).tagged_ptr = (uintptr_t)inode;
      account_growing_inode<(unodb::node_type)1>(this);
      k_local.field_0.key_bytes._M_elems[0xf] = 1;
      std::
      unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_108);
      std::
      unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_d8);
    }
  }
  return (bool)k_local.field_0.key_bytes._M_elems[0xf];
}

Assistant:

bool db<Key, Value>::insert_internal(art_key_type k, value_type v) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) {
    auto leaf = art_policy::make_db_leaf_ptr(k, v, *this);
    root = detail::node_ptr{leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    if (node_type == node_type::LEAF) {
      auto* const leaf{node->template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      const auto cmp = k.cmp(existing_key);
      if (UNODB_DETAIL_UNLIKELY(cmp == 0)) {
        return false;  // exists
      }
      // Replace the existing leaf with a new N4 and put the existing
      // leaf and the leaf for the caller's key and value under the
      // new inode as its direct children.
      auto new_leaf = art_policy::make_db_leaf_ptr(k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth,
                                    leaf, std::move(new_leaf))};
      *node = detail::node_ptr{new_node.release(), node_type::I4};
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) {
      // We have reached an existing inode whose key_prefix is greater
      // than the desired match.  We need to split this inode into a
      // new N4 whose children are the existing inode and a new child
      // leaf.
      auto leaf = art_policy::make_db_leaf_ptr(k, v, *this);
      auto new_node = inode_4::create(*this, *node, shared_prefix_len, depth,
                                      std::move(leaf));
      *node = detail::node_ptr{new_node.release(), node_type::I4};
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      ++key_prefix_splits;
      UNODB_DETAIL_ASSERT(growing_inode_counts[internal_as_i<node_type::I4>] >
                          key_prefix_splits);
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }
    // key_prefix bytes were absorbed during the descent.  Now we need
    // to either descend along an existing child or create a new child.
    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    node = inode->template add_or_choose_subtree<detail::node_ptr*>(
        node_type, remaining_key[0], k, v, *this, depth, node);

    if (node == nullptr) return true;

    ++depth;
    remaining_key.shift_right(1);
  }
}